

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void * flatcc_builder_aligned_alloc(size_t alignment,size_t size)

{
  void *pvVar1;
  size_t size_local;
  size_t alignment_local;
  
  pvVar1 = __portable_aligned_alloc(alignment,size);
  return pvVar1;
}

Assistant:

void *flatcc_builder_aligned_alloc(size_t alignment, size_t size)
{
    return FLATCC_BUILDER_ALIGNED_ALLOC(alignment, size);
}